

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

QByteArray * qEncodeHmacMd5(QByteArray *key,QByteArrayView message)

{
  QByteArrayView a;
  QByteArrayView a_00;
  qsizetype qVar1;
  QByteArrayView *this;
  char *pcVar2;
  byte *pbVar3;
  QByteArray *this_00;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int i;
  QByteArray *hmacDigest;
  QByteArrayView hMsg;
  QByteArray oKeyPad;
  QByteArray iKeyPad;
  QCryptographicHash hash;
  int in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  QByteArray *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  QByteArrayView *in_stack_fffffffffffffed0;
  QByteArray *pQVar4;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  undefined1 uVar5;
  int local_110;
  int local_10c;
  undefined1 local_90 [64];
  QByteArray local_50;
  QByteArray local_38;
  undefined8 local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20[0] = 0xaaaaaaaaaaaaaaaa;
  pQVar4 = in_RDI;
  QCryptographicHash::QCryptographicHash((QCryptographicHash *)local_20,Md5);
  local_38.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_38.d.size = -0x5555555555555556;
  QByteArray::QByteArray(&local_38,0x40,'6');
  local_50.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_50.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_50.d.size = -0x5555555555555556;
  QByteArray::QByteArray(&local_50,0x40,'\\');
  QCryptographicHash::reset();
  qVar1 = QByteArray::size(in_RSI);
  if (0x40 < qVar1) {
    QByteArrayView::QByteArrayView<QByteArray,_true>
              (in_stack_fffffffffffffed0,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QCryptographicHash::addData((QByteArrayView *)local_20);
    QCryptographicHash::result();
    QByteArray::operator=
              (in_stack_fffffffffffffec0,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QByteArray::~QByteArray((QByteArray *)0x209683);
  }
  QByteArray::leftJustified((longlong)local_90,(char)in_RSI,true);
  QByteArray::operator=
            (in_stack_fffffffffffffec0,
             (QByteArray *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  QByteArray::~QByteArray((QByteArray *)0x2096c1);
  local_10c = 0;
  while( true ) {
    this = (QByteArrayView *)(long)local_10c;
    qVar1 = QByteArray::size(in_RSI);
    if (qVar1 <= (long)this) break;
    pcVar2 = QByteArray::operator[]
                       ((QByteArray *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                        0x2096f9);
    in_stack_fffffffffffffec8 = (int)*pcVar2;
    pbVar3 = (byte *)QByteArray::operator[]
                               ((QByteArray *)
                                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                0x209712);
    in_stack_fffffffffffffecc =
         CONCAT13((byte)in_stack_fffffffffffffec8 ^ *pbVar3,(int3)in_stack_fffffffffffffecc);
    pcVar2 = QByteArray::operator[]
                       ((QByteArray *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                        0x209734);
    *pcVar2 = (char)((uint)in_stack_fffffffffffffecc >> 0x18);
    local_10c = local_10c + 1;
  }
  local_110 = 0;
  while( true ) {
    this_00 = (QByteArray *)(long)local_110;
    qVar1 = QByteArray::size(in_RSI);
    if (qVar1 <= (long)this_00) break;
    pcVar2 = QByteArray::operator[]
                       ((QByteArray *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                        0x20977f);
    in_stack_fffffffffffffeb8 = (int)*pcVar2;
    pbVar3 = (byte *)QByteArray::operator[]
                               ((QByteArray *)
                                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                0x209797);
    in_stack_fffffffffffffebc =
         CONCAT13((byte)in_stack_fffffffffffffeb8 ^ *pbVar3,(int3)in_stack_fffffffffffffebc);
    pcVar2 = QByteArray::operator[]
                       ((QByteArray *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                        0x2097b8);
    *pcVar2 = (char)((uint)in_stack_fffffffffffffebc >> 0x18);
    local_110 = local_110 + 1;
  }
  a.m_data._0_7_ = in_stack_fffffffffffffee8;
  a.m_size = (qsizetype)pQVar4;
  a.m_data._7_1_ = in_stack_fffffffffffffeef;
  QByteArray::append((QByteArray *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),a);
  QCryptographicHash::reset();
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (this,(QByteArray *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  QCryptographicHash::addData((QByteArrayView *)local_20);
  QCryptographicHash::resultView();
  uVar5 = 0;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QByteArray::QByteArray((QByteArray *)0x2098b1);
  a_00.m_data._0_7_ = in_stack_fffffffffffffee8;
  a_00.m_size = (qsizetype)pQVar4;
  a_00.m_data._7_1_ = uVar5;
  QByteArray::append((QByteArray *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     a_00);
  QCryptographicHash::reset();
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (this,(QByteArray *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  QCryptographicHash::addData((QByteArrayView *)local_20);
  QCryptographicHash::result();
  QByteArray::operator=
            (this_00,(QByteArray *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  QByteArray::~QByteArray((QByteArray *)0x209949);
  QByteArray::~QByteArray((QByteArray *)0x20996c);
  QByteArray::~QByteArray((QByteArray *)0x209979);
  QCryptographicHash::~QCryptographicHash((QCryptographicHash *)local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QByteArray qEncodeHmacMd5(QByteArray &key, QByteArrayView message)
{
    Q_ASSERT_X(!(message.isEmpty()),"qEncodeHmacMd5", "Empty message check");
    Q_ASSERT_X(!(key.isEmpty()),"qEncodeHmacMd5", "Empty key check");

    QCryptographicHash hash(QCryptographicHash::Md5);

    QByteArray iKeyPad(blockSize, 0x36);
    QByteArray oKeyPad(blockSize, 0x5c);

    hash.reset();
    // Adjust the key length to blockSize

    if (blockSize < key.size()) {
        hash.addData(key);
        key = hash.result(); //MD5 will always return 16 bytes length output
    }

    //Key will be <= 16 or 20 bytes as hash function (MD5 or SHA hash algorithms)
    //key size can be max of Block size only
    key = key.leftJustified(blockSize,0,true);

    //iKeyPad, oKeyPad and key are all of same size "blockSize"

    //xor of iKeyPad with Key and store the result into iKeyPad
    for(int i = 0; i<key.size();i++) {
        iKeyPad[i] = key[i]^iKeyPad[i];
    }

    //xor of oKeyPad with Key and store the result into oKeyPad
    for(int i = 0; i<key.size();i++) {
        oKeyPad[i] = key[i]^oKeyPad[i];
    }

    iKeyPad.append(message); // (K0 xor ipad) || text

    hash.reset();
    hash.addData(iKeyPad);
    QByteArrayView hMsg = hash.resultView();
                    //Digest gen after pass-1: H((K0 xor ipad)||text)

    QByteArray hmacDigest;
    oKeyPad.append(hMsg);
    hash.reset();
    hash.addData(oKeyPad);
    hmacDigest = hash.result();
                    // H((K0 xor opad )|| H((K0 xor ipad) || text))

    /*hmacDigest should not be less than half the length of the HMAC output
      (to match the birthday attack bound) and not less than 80 bits
      (a suitable lower bound on the number of bits that need to be
      predicted by an attacker).
      Refer RFC 2104 for more details on truncation part */

    /*MD5 hash always returns 16 byte digest only and HMAC-MD5 spec
      (RFC 2104) also says digest length should be 16 bytes*/
    return hmacDigest;
}